

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

void secp256k1_context_preallocated_destroy(secp256k1_context *ctx)

{
  if (secp256k1_context_no_precomp == ctx) {
    secp256k1_context_preallocated_destroy_cold_1();
  }
  if (ctx != (secp256k1_context *)0x0) {
    (ctx->ecmult_gen_ctx).built = 0;
    memset(&(ctx->ecmult_gen_ctx).blind,0,0x9c);
    return;
  }
  return;
}

Assistant:

void secp256k1_context_preallocated_destroy(secp256k1_context* ctx) {
    ARG_CHECK_NO_RETURN(ctx != secp256k1_context_no_precomp);
    if (ctx != NULL) {
        secp256k1_ecmult_gen_context_clear(&ctx->ecmult_gen_ctx);
    }
}